

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O2

void __thiscall
RenX_LoggingPlugin::RenX_OnCharacterCrate
          (RenX_LoggingPlugin *this,Server *server,PlayerInfo *player,string_view character)

{
  undefined8 uVar1;
  undefined8 uVar2;
  code *pcVar3;
  undefined1 auVar4 [16];
  string msg;
  undefined8 local_50;
  long local_48;
  
  if ((*(ulong *)&this->field_0xa0 >> 0x2b & 1) == 0) {
    pcVar3 = RenX::Server::sendAdmChan;
  }
  else {
    pcVar3 = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)&local_50,&this->characterCrateFmt);
  if (local_48 != 0) {
    RenX::processTags((string *)&local_50,server,player,(PlayerInfo *)0x0,(BuildingInfo *)0x0);
    uVar1 = *(undefined8 *)(RenX::tags + 0x968);
    uVar2 = *(undefined8 *)(RenX::tags + 0x970);
    auVar4 = RenX::translateName(character._M_len,character._M_str);
    RenX::replace_tag(&local_50,uVar2,uVar1,auVar4._0_8_,auVar4._8_8_);
    (*pcVar3)(server,local_48,local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnCharacterCrate(RenX::Server &server, const RenX::PlayerInfo &player, std::string_view character)
{
	logFuncType func;
	if (RenX_LoggingPlugin::characterCratePublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->characterCrateFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &player);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_CHARACTER_TAG, RenX::translateName(character));
		(server.*func)(msg);
	}
}